

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

void Extra_PrintHexadecimalString(char *pString,uint *Sign,int nVars)

{
  char cVar1;
  uint uVar2;
  int local_28;
  int k;
  int Digit;
  int nDigits;
  int nVars_local;
  uint *Sign_local;
  char *pString_local;
  
  if ((nVars == 0) && ((*Sign & 1) == 0)) {
    sprintf(pString,"0");
  }
  else if ((nVars == 0) && ((*Sign & 1) != 0)) {
    sprintf(pString,"1");
  }
  else if ((nVars == 1) && ((*Sign & 1) != 0)) {
    sprintf(pString,"1");
  }
  else if ((nVars == 1) && ((*Sign & 1) == 0)) {
    sprintf(pString,"2");
  }
  else {
    local_28 = (1 << ((byte)nVars & 0x1f)) / 4;
    Sign_local = (uint *)pString;
    while (local_28 = local_28 + -1, -1 < local_28) {
      uVar2 = Sign[local_28 / 8] >> ((byte)(local_28 % 8 << 2) & 0x1f) & 0xf;
      cVar1 = (char)uVar2;
      if (uVar2 < 10) {
        *(char *)Sign_local = cVar1 + '0';
      }
      else {
        *(char *)Sign_local = cVar1 + 'W';
      }
      Sign_local = (uint *)((long)Sign_local + 1);
    }
    *(undefined1 *)Sign_local = 0;
  }
  return;
}

Assistant:

void Extra_PrintHexadecimalString( char * pString, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    if ( nVars == 0 && !(Sign[0] & 1) ) { sprintf(pString, "0"); return; } // const0
    if ( nVars == 0 &&  (Sign[0] & 1) ) { sprintf(pString, "1"); return; } // const1
    if ( nVars == 1 &&  (Sign[0] & 1) ) { sprintf(pString, "1"); return; } // inverter
    if ( nVars == 1 && !(Sign[0] & 1) ) { sprintf(pString, "2"); return; } // buffer
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pString++ = '0' + Digit;
        else
            *pString++ = 'a' + Digit-10;
    }
//    fprintf( pFile, "\n" );
    *pString = 0;
}